

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

string * FormatParagraph_abi_cxx11_
                   (string *__return_storage_ptr__,string_view in,size_t width,size_t indent)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  void *pvVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  stringstream out;
  size_t local_210;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  stringstream local_1c0 [16];
  ostream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_1f0._M_str = in._M_str;
  local_1f0._M_len = in._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (width < indent) {
LAB_001c17aa:
    __assert_fail("width >= indent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/strencodings.cpp"
                  ,0x100,"std::string FormatParagraph(std::string_view, size_t, size_t)");
  }
  std::__cxx11::stringstream::stringstream(local_1c0);
  if (local_1f0._M_len != 0) {
    uVar6 = 0;
    local_210 = 0;
    do {
      pcVar2 = local_1f0._M_str;
      sVar1 = local_1f0._M_len;
      uVar7 = local_1f0._M_len - uVar6;
      __s = local_1f0._M_str + uVar6;
      pvVar3 = memchr(__s,10,uVar7);
      sVar4 = (long)pvVar3 - (long)pcVar2;
      if ((long)pvVar3 - (long)pcVar2 == 0xffffffffffffffff) {
        sVar4 = sVar1;
      }
      if (pvVar3 == (void *)0x0) {
        sVar4 = sVar1;
      }
      if (width - local_210 < sVar4 - uVar6) {
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                          (&local_1f0," \n",(width - local_210) + uVar6,2);
        if (sVar4 == 0xffffffffffffffff || sVar4 < uVar6) {
          sVar4 = uVar6;
          if (uVar6 < local_1f0._M_len) {
            while ((local_1f0._M_str[sVar4] != '\n' && (local_1f0._M_str[sVar4] != ' '))) {
              sVar4 = sVar4 + 1;
              if (local_1f0._M_len == sVar4) goto LAB_001c1705;
            }
            goto LAB_001c1633;
          }
LAB_001c1705:
          if (uVar6 <= local_1f0._M_len) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1b0,local_1f0._M_str + uVar6,local_1f0._M_len - uVar6);
            break;
          }
        }
        else {
LAB_001c1633:
          if (uVar6 <= local_1f0._M_len) {
            uVar7 = sVar4 - uVar6;
            if (local_1f0._M_len - uVar6 < sVar4 - uVar6) {
              uVar7 = local_1f0._M_len - uVar6;
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1b0,local_1f0._M_str + uVar6,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if (local_1f0._M_str[sVar4] == '\n') {
              local_210 = 0;
            }
            if (local_1f0._M_str[sVar4] != '\n' && indent != 0) {
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_1e0,indent,' ');
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_1b0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
              local_210 = indent;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p,
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
            }
            goto LAB_001c16ef;
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001c1846;
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar6);
        goto LAB_001c17aa;
      }
      uVar6 = (sVar4 - uVar6) + 1;
      if (uVar7 < uVar6) {
        uVar6 = uVar7;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0,__s,uVar6);
      local_210 = 0;
LAB_001c16ef:
      uVar6 = sVar4 + 1;
    } while (uVar6 < local_1f0._M_len);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001c1846:
  __stack_chk_fail();
}

Assistant:

std::string FormatParagraph(std::string_view in, size_t width, size_t indent)
{
    assert(width >= indent);
    std::stringstream out;
    size_t ptr = 0;
    size_t indented = 0;
    while (ptr < in.size())
    {
        size_t lineend = in.find_first_of('\n', ptr);
        if (lineend == std::string::npos) {
            lineend = in.size();
        }
        const size_t linelen = lineend - ptr;
        const size_t rem_width = width - indented;
        if (linelen <= rem_width) {
            out << in.substr(ptr, linelen + 1);
            ptr = lineend + 1;
            indented = 0;
        } else {
            size_t finalspace = in.find_last_of(" \n", ptr + rem_width);
            if (finalspace == std::string::npos || finalspace < ptr) {
                // No place to break; just include the entire word and move on
                finalspace = in.find_first_of("\n ", ptr);
                if (finalspace == std::string::npos) {
                    // End of the string, just add it and break
                    out << in.substr(ptr);
                    break;
                }
            }
            out << in.substr(ptr, finalspace - ptr) << "\n";
            if (in[finalspace] == '\n') {
                indented = 0;
            } else if (indent) {
                out << std::string(indent, ' ');
                indented = indent;
            }
            ptr = finalspace + 1;
        }
    }
    return out.str();
}